

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrclut_p.h
# Opt level: O2

QRgba64 __thiscall QColorTrcLut::toLinear64(QColorTrcLut *this,QRgb rgb32)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  type puVar4;
  byte bVar6;
  undefined1 auVar5 [16];
  
  bVar6 = (byte)(rgb32 >> 0x18);
  auVar5 = psllw(ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)bVar6 <<
                                                                                  0x30) >> 0x28),
                                                                          CONCAT14((char)(rgb32 >> 
                                                  0x10),rgb32)) >> 0x20),rgb32) >> 0x18),
                                           (char)(rgb32 >> 8)),(ushort)(byte)rgb32) &
                         0xffffff00ffffff),4);
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (&this->m_toLinear,(ulong)auVar5._4_2_);
  uVar1 = *puVar4;
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (&this->m_toLinear,(ulong)auVar5._2_2_);
  uVar2 = *puVar4;
  puVar4 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (&this->m_toLinear,(ulong)auVar5._0_2_);
  uVar3 = SUB162(ZEXT116(bVar6) << 0x38,6);
  return (QRgba64)CONCAT26((uVar3 >> 8) + uVar3,
                           CONCAT24((*puVar4 >> 8) + *puVar4,
                                    CONCAT22((uVar2 >> 8) + uVar2,(uVar1 >> 8) + uVar1)));
}

Assistant:

QRgba64 toLinear64(QRgb rgb32) const
    {
#if defined(__SSE2__)
        __m128i v = _mm_cvtsi32_si128(rgb32);
        v = _mm_unpacklo_epi8(v, _mm_setzero_si128());
        const __m128i vidx = _mm_slli_epi16(v, ShiftUp);
        const int ridx = _mm_extract_epi16(vidx, 2);
        const int gidx = _mm_extract_epi16(vidx, 1);
        const int bidx = _mm_extract_epi16(vidx, 0);
        v = _mm_slli_epi16(v, 8); // a * 256
        v = _mm_insert_epi16(v, m_toLinear[ridx], 0);
        v = _mm_insert_epi16(v, m_toLinear[gidx], 1);
        v = _mm_insert_epi16(v, m_toLinear[bidx], 2);
        v = _mm_add_epi16(v, _mm_srli_epi16(v, 8));
        QRgba64 rgba64;
        _mm_storel_epi64(reinterpret_cast<__m128i *>(&rgba64), v);
        return rgba64;
#elif defined(__ARM_NEON__) && Q_BYTE_ORDER == Q_LITTLE_ENDIAN
        uint8x8_t v8 = vreinterpret_u8_u32(vmov_n_u32(rgb32));
        uint16x4_t v16 = vget_low_u16(vmovl_u8(v8));
        const uint16x4_t vidx = vshl_n_u16(v16, ShiftUp);
        const int ridx = vget_lane_u16(vidx, 2);
        const int gidx = vget_lane_u16(vidx, 1);
        const int bidx = vget_lane_u16(vidx, 0);
        v16 = vshl_n_u16(v16, 8); // a * 256
        v16 = vset_lane_u16(m_toLinear[ridx], v16, 0);
        v16 = vset_lane_u16(m_toLinear[gidx], v16, 1);
        v16 = vset_lane_u16(m_toLinear[bidx], v16, 2);
        v16 = vadd_u16(v16, vshr_n_u16(v16, 8));
        return QRgba64::fromRgba64(vget_lane_u64(vreinterpret_u64_u16(v16), 0));
#else
        uint r = m_toLinear[qRed(rgb32) << ShiftUp];
        uint g = m_toLinear[qGreen(rgb32) << ShiftUp];
        uint b = m_toLinear[qBlue(rgb32) << ShiftUp];
        r = r + (r >> 8);
        g = g + (g >> 8);
        b = b + (b >> 8);
        return QRgba64::fromRgba64(r, g, b, qAlpha(rgb32) * 257);
#endif
    }